

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

bool_t strStartsWith(char *str,char *prefix)

{
  char cVar1;
  long lVar2;
  
  cVar1 = *prefix;
  if (cVar1 != '\0') {
    lVar2 = 0;
    do {
      if (str[lVar2] != cVar1) {
        return 0;
      }
      cVar1 = prefix[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (cVar1 != '\0');
  }
  return 1;
}

Assistant:

bool_t strStartsWith(const char* str, const char* prefix)
{
	ASSERT(strIsValid(str));
	ASSERT(strIsValid(prefix));
	for(; *prefix; ++prefix, ++str)
		if (*str != *prefix)
			return FALSE;
	return TRUE;
}